

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool unshield_read_common_header(uint8_t **buffer,CommonHeader *common)

{
  uint8_t *p_00;
  uint32_t uVar1;
  uint8_t *p;
  CommonHeader *common_local;
  uint8_t **buffer_local;
  
  p_00 = *buffer;
  uVar1 = get_unaligned_le32(p_00);
  common->signature = uVar1;
  if (common->signature == 0x28635349) {
    uVar1 = get_unaligned_le32(p_00 + 4);
    common->version = uVar1;
    uVar1 = get_unaligned_le32(p_00 + 8);
    common->volume_info = uVar1;
    uVar1 = get_unaligned_le32(p_00 + 0xc);
    common->cab_descriptor_offset = uVar1;
    uVar1 = get_unaligned_le32(p_00 + 0x10);
    common->cab_descriptor_size = uVar1;
    *buffer = p_00 + 0x14;
    buffer_local._7_1_ = true;
  }
  else {
    _unshield_log(1,"unshield_read_common_header",0xa6,"Invalid file signature");
    if (common->signature == 0x4643534d) {
      _unshield_log(2,"unshield_read_common_header",0xa9,
                    "Found Microsoft Cabinet header. Use cabextract (https://www.cabextract.org.uk/) to unpack this file."
                   );
    }
    buffer_local._7_1_ = false;
  }
  return buffer_local._7_1_;
}

Assistant:

bool unshield_read_common_header(uint8_t** buffer, CommonHeader* common)
{
  uint8_t* p = *buffer;
  common->signature              = READ_UINT32(p); p += 4;

  if (CAB_SIGNATURE != common->signature)
  {
    unshield_error("Invalid file signature");

    if (MSCF_SIGNATURE == common->signature)
      unshield_warning("Found Microsoft Cabinet header. Use cabextract (https://www.cabextract.org.uk/) to unpack this file.");

    return false;
  }

  common->version                = READ_UINT32(p); p += 4;
  common->volume_info            = READ_UINT32(p); p += 4;
  common->cab_descriptor_offset  = READ_UINT32(p); p += 4;
  common->cab_descriptor_size    = READ_UINT32(p); p += 4;

#if VERBOSE
  unshield_trace("Common header: %08x %08x %08x %08x",
      common->version, 
      common->volume_info, 
      common->cab_descriptor_offset, 
      common->cab_descriptor_size);
#endif

  *buffer = p;
  return true;
}